

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser_common.c
# Opt level: O3

void lys_parser_fill_filepath(ly_ctx *ctx,ly_in *in,char **filepath)

{
  ssize_t sVar1;
  ulong len;
  char *pcVar2;
  char proc_path [32];
  char path [4096];
  char acStack_1038 [32];
  char local_1018 [4096];
  
  if (ctx == (ly_ctx *)0x0) {
    pcVar2 = "ctx";
  }
  else if (in == (ly_in *)0x0) {
    pcVar2 = "in";
  }
  else {
    if (filepath != (char **)0x0) {
      if (*filepath == (char *)0x0) {
        switch(in->type) {
        case LY_IN_FD:
          sprintf(acStack_1038,"/proc/self/fd/%d",(ulong)(uint)(in->method).fd);
          sVar1 = readlink(acStack_1038,local_1018,0xfff);
          if ((int)(uint)sVar1 < 1) {
            return;
          }
          len = (ulong)((uint)sVar1 & 0x7fffffff);
          pcVar2 = local_1018;
          break;
        case LY_IN_FILE:
        case LY_IN_MEMORY:
          goto switchD_001663f0_caseD_1;
        case LY_IN_FILEPATH:
          pcVar2 = realpath((in->method).fpath.filepath,local_1018);
          if (pcVar2 == (char *)0x0) {
            pcVar2 = (in->method).fpath.filepath;
          }
          else {
            pcVar2 = local_1018;
          }
          len = 0;
          break;
        default:
          ly_log(ctx,LY_LLERR,LY_EINT,"Internal error (%s:%d).",
                 "/workspace/llm4binary/github/license_c_cmakelists/CESNET[P]libyang/src/parser_common.c"
                 ,0x213);
          return;
        }
        lydict_insert(ctx,pcVar2,len,filepath);
      }
switchD_001663f0_caseD_1:
      return;
    }
    pcVar2 = "filepath";
  }
  ly_log((ly_ctx *)0x0,LY_LLERR,LY_EINVAL,"Invalid argument %s (%s()).",pcVar2,
         "lys_parser_fill_filepath");
  return;
}

Assistant:

void
lys_parser_fill_filepath(struct ly_ctx *ctx, struct ly_in *in, const char **filepath)
{
    char path[PATH_MAX];

#ifndef __APPLE__
    char proc_path[32];
    int len;
#endif

    LY_CHECK_ARG_RET(NULL, ctx, in, filepath, );
    if (*filepath) {
        /* filepath already set */
        return;
    }

    switch (in->type) {
    case LY_IN_FILEPATH:
        if (realpath(in->method.fpath.filepath, path) != NULL) {
            lydict_insert(ctx, path, 0, filepath);
        } else {
            lydict_insert(ctx, in->method.fpath.filepath, 0, filepath);
        }

        break;
    case LY_IN_FD:
#ifdef __APPLE__
        if (fcntl(in->method.fd, F_GETPATH, path) != -1) {
            lydict_insert(ctx, path, 0, filepath);
        }
#elif defined _WIN32
        HANDLE h = _get_osfhandle(in->method.fd);
        FILE_NAME_INFO info;

        if (GetFileInformationByHandleEx(h, FileNameInfo, &info, sizeof info)) {
            char *buf = calloc(info.FileNameLength + 1 /* trailing NULL */, MB_CUR_MAX);

            len = wcstombs(buf, info.FileName, info.FileNameLength * MB_CUR_MAX);
            lydict_insert(ctx, buf, len, filepath);
        }
#else
        /* get URI if there is /proc */
        sprintf(proc_path, "/proc/self/fd/%d", in->method.fd);
        if ((len = readlink(proc_path, path, PATH_MAX - 1)) > 0) {
            lydict_insert(ctx, path, len, filepath);
        }
#endif
        break;
    case LY_IN_MEMORY:
    case LY_IN_FILE:
        /* nothing to do */
        break;
    default:
        LOGINT(ctx);
        break;
    }
}